

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,RepeatLoopStatement *stmt)

{
  bool bVar1;
  DataFlowState *ctx;
  DataFlowState *this_00;
  ConstantValue cv;
  DataFlowState currState;
  type oldBreakStates;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_380;
  DataFlowState local_358;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_2b8;
  DataFlowState local_160;
  DataFlowState local_c0;
  
  visitCondition((ConstantValue *)&local_380,this,stmt->count);
  unsplit(this);
  DataFlowAnalysis::copyState(&local_358,(DataFlowAnalysis *)this,&this->state);
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            (&local_2b8,&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            (&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  bVar1 = ConstantValue::isTrue((ConstantValue *)&local_380);
  if (bVar1) {
    this_00 = &local_c0;
    DataFlowState::DataFlowState(this_00,&this->state);
    ctx = this_00;
    loopTail(this,this_00,&local_2b8);
  }
  else {
    this_00 = &local_160;
    DataFlowState::DataFlowState(this_00,&local_358);
    ctx = this_00;
    loopTail(this,this_00,&local_2b8);
  }
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)this_00,
             (EVP_PKEY_CTX *)ctx);
  SmallVectorBase<slang::analysis::DataFlowState>::cleanup
            (&local_2b8.super_SmallVectorBase<slang::analysis::DataFlowState>,(EVP_PKEY_CTX *)ctx);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_358,
             (EVP_PKEY_CTX *)ctx);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_380);
  return;
}

Assistant:

void visitStmt(const RepeatLoopStatement& stmt) {
        auto cv = visitCondition(stmt.count);
        unsplit();

        auto currState = (DERIVED).copyState(state);
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        // If the repeat count is known to be positive we know the
        // body will execute at least once so we can keep our current
        // state; otherwise we need to join with the pre-loop state.
        if (cv.isTrue())
            loopTail(std::move(state), std::move(oldBreakStates));
        else
            loopTail(std::move(currState), std::move(oldBreakStates));
    }